

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O3

void slang::assert::assertFailed(char *expr,char *file,int line,char *func)

{
  logic_error *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_88;
  char *local_68 [2];
  char *local_58;
  ulong local_48;
  char *local_38;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  local_48 = (ulong)(uint)line;
  fmt.size_ = 0xc1cc;
  fmt.data_ = (char *)0x3b;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_68;
  local_68[0] = expr;
  local_58 = file;
  local_38 = func;
  ::fmt::v9::vformat_abi_cxx11_
            (&sStack_88,(v9 *)"Assertion \'{}\' failed\n  in file {}, line {}\n  function: {}\n",fmt
             ,args);
  std::logic_error::logic_error(this,(string *)&sStack_88);
  *(undefined ***)this = &PTR__logic_error_005080b0;
  __cxa_throw(this,&AssertionException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

[[noreturn]] void assertFailed(const char* expr, const char* file, int line, const char* func) {
    throw AssertionException(fmt::format("Assertion '{}' failed\n  in file {}, line {}\n"
                                         "  function: {}\n",
                                         expr, file, line, func));
}